

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalUnixMakefileGenerator3.cxx
# Opt level: O1

void __thiscall
cmGlobalUnixMakefileGenerator3::WriteDirectoryRule2
          (cmGlobalUnixMakefileGenerator3 *this,ostream *ruleFileStream,
          cmLocalUnixMakefileGenerator3 *lg,char *pass,bool check_all,bool check_relink,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *commands)

{
  pointer pcVar1;
  pointer ppcVar2;
  cmGeneratorTarget *this_00;
  bool bVar3;
  char cVar4;
  TargetType TVar5;
  string *psVar6;
  pointer ppcVar7;
  pointer this_01;
  bool bVar8;
  string makeTarget;
  string doc;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  depends;
  string local_a0;
  vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_> local_80;
  ostream *local_68;
  cmGlobalUnixMakefileGenerator3 *local_60;
  string *local_58;
  string subdir;
  
  local_68 = ruleFileStream;
  local_60 = this;
  psVar6 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_((cmLocalGenerator *)lg);
  makeTarget._M_dataplus._M_p = (pointer)&makeTarget.field_2;
  pcVar1 = (psVar6->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&makeTarget,pcVar1,pcVar1 + psVar6->_M_string_length);
  std::__cxx11::string::push_back('\0');
  std::__cxx11::string::append((char *)&makeTarget);
  depends.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  depends.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  depends.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ppcVar7 = (lg->super_cmLocalCommonGenerator).super_cmLocalGenerator.GeneratorTargets.
            super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppcVar2 = (lg->super_cmLocalCommonGenerator).super_cmLocalGenerator.GeneratorTargets.
            super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppcVar7 != ppcVar2) {
    local_58 = &(lg->super_cmLocalCommonGenerator).ConfigName;
    do {
      this_00 = *ppcVar7;
      TVar5 = cmGeneratorTarget::GetType(this_00);
      if (TVar5 < GLOBAL_TARGET) {
        cVar4 = check_all;
        if (check_all) {
          local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"EXCLUDE_FROM_ALL","")
          ;
          bVar3 = cmGeneratorTarget::GetPropertyAsBool(this_00,&local_a0);
          if (!bVar3 && check_relink) {
LAB_0032a176:
            bVar8 = cmGeneratorTarget::NeedRelinkBeforeInstall(this_00,local_58);
          }
          else {
            bVar8 = !bVar3;
            cVar4 = bVar3 || check_all;
          }
        }
        else {
          bVar8 = true;
          if (check_relink) goto LAB_0032a176;
        }
        if ((cVar4 != '\0') &&
           ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a0._M_dataplus._M_p != &local_a0.field_2)) {
          operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
        }
        if (bVar8 != false) {
          cmLocalUnixMakefileGenerator3::GetRelativeTargetDirectory_abi_cxx11_(&doc,lg,this_00);
          std::__cxx11::string::append((char *)&doc);
          std::__cxx11::string::append((char *)&doc);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&depends,
                     &doc);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)doc._M_dataplus._M_p != &doc.field_2) {
            operator_delete(doc._M_dataplus._M_p,
                            CONCAT71(doc.field_2._M_allocated_capacity._1_7_,
                                     doc.field_2._M_local_buf[0]) + 1);
          }
        }
      }
      ppcVar7 = ppcVar7 + 1;
    } while (ppcVar7 != ppcVar2);
  }
  cmLocalGenerator::GetStateSnapshot((cmStateSnapshot *)&doc,(cmLocalGenerator *)lg);
  cmStateSnapshot::GetChildren(&local_80,(cmStateSnapshot *)&doc);
  if (local_80.super__Vector_base<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_80.super__Vector_base<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    this_01 = local_80.super__Vector_base<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>._M_impl
              .super__Vector_impl_data._M_start;
    do {
      cmStateSnapshot::GetDirectory((cmStateDirectory *)&doc,this_01);
      psVar6 = cmStateDirectory::GetCurrentBinary_abi_cxx11_((cmStateDirectory *)&doc);
      pcVar1 = (psVar6->_M_dataplus)._M_p;
      subdir._M_dataplus._M_p = (pointer)&subdir.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&subdir,pcVar1,pcVar1 + psVar6->_M_string_length);
      std::__cxx11::string::push_back((char)&subdir);
      std::__cxx11::string::append((char *)&subdir);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&depends,
                 &subdir);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)subdir._M_dataplus._M_p != &subdir.field_2) {
        operator_delete(subdir._M_dataplus._M_p,subdir.field_2._M_allocated_capacity + 1);
      }
      this_01 = this_01 + 1;
    } while (this_01 !=
             local_80.super__Vector_base<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  if (local_80.super__Vector_base<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>._M_impl.
      super__Vector_impl_data._M_start != (cmStateSnapshot *)0x0) {
    operator_delete(local_80.super__Vector_base<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_80.
                          super__Vector_base<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_80.
                          super__Vector_base<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if ((depends.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start ==
       depends.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish) &&
     ((local_60->EmptyRuleHackDepends)._M_string_length != 0)) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&depends,&local_60->EmptyRuleHackDepends);
  }
  doc._M_string_length = 0;
  doc.field_2._M_local_buf[0] = '\0';
  doc._M_dataplus._M_p = (pointer)&doc.field_2;
  bVar8 = cmLocalGenerator::IsRootMakefile((cmLocalGenerator *)lg);
  if (bVar8) {
    std::__cxx11::string::_M_replace((ulong)&doc,0,(char *)doc._M_string_length,0x5417cd);
    std::__cxx11::string::append((char *)&doc);
  }
  else {
    std::__cxx11::string::_M_replace((ulong)&doc,0,(char *)doc._M_string_length,0x5417ec);
    std::__cxx11::string::append((char *)&doc);
  }
  std::__cxx11::string::append((char *)&doc);
  cmLocalUnixMakefileGenerator3::WriteMakeRule
            (lg,local_68,doc._M_dataplus._M_p,&makeTarget,&depends,commands,true,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)doc._M_dataplus._M_p != &doc.field_2) {
    operator_delete(doc._M_dataplus._M_p,
                    CONCAT71(doc.field_2._M_allocated_capacity._1_7_,doc.field_2._M_local_buf[0]) +
                    1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&depends);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)makeTarget._M_dataplus._M_p != &makeTarget.field_2) {
    operator_delete(makeTarget._M_dataplus._M_p,makeTarget.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmGlobalUnixMakefileGenerator3::WriteDirectoryRule2(
  std::ostream& ruleFileStream, cmLocalUnixMakefileGenerator3* lg,
  const char* pass, bool check_all, bool check_relink,
  std::vector<std::string> const& commands)
{
  // Get the relative path to the subdirectory from the top.
  std::string makeTarget = lg->GetCurrentBinaryDirectory();
  makeTarget += '/';
  makeTarget += pass;

  // The directory-level rule should depend on the target-level rules
  // for all targets in the directory.
  std::vector<std::string> depends;
  for (cmGeneratorTarget* gtarget : lg->GetGeneratorTargets()) {
    int type = gtarget->GetType();
    if ((type == cmStateEnums::EXECUTABLE) ||
        (type == cmStateEnums::STATIC_LIBRARY) ||
        (type == cmStateEnums::SHARED_LIBRARY) ||
        (type == cmStateEnums::MODULE_LIBRARY) ||
        (type == cmStateEnums::OBJECT_LIBRARY) ||
        (type == cmStateEnums::UTILITY)) {
      // Add this to the list of depends rules in this directory.
      if ((!check_all || !gtarget->GetPropertyAsBool("EXCLUDE_FROM_ALL")) &&
          (!check_relink ||
           gtarget->NeedRelinkBeforeInstall(lg->GetConfigName()))) {
        std::string tname = lg->GetRelativeTargetDirectory(gtarget);
        tname += "/";
        tname += pass;
        depends.push_back(std::move(tname));
      }
    }
  }

  // The directory-level rule should depend on the directory-level
  // rules of the subdirectories.
  for (cmStateSnapshot const& c : lg->GetStateSnapshot().GetChildren()) {
    std::string subdir = c.GetDirectory().GetCurrentBinary();
    subdir += '/';
    subdir += pass;
    depends.push_back(std::move(subdir));
  }

  // Work-around for makes that drop rules that have no dependencies
  // or commands.
  if (depends.empty() && !this->EmptyRuleHackDepends.empty()) {
    depends.push_back(this->EmptyRuleHackDepends);
  }

  // Write the rule.
  std::string doc;
  if (lg->IsRootMakefile()) {
    doc = "The main recursive \"";
    doc += pass;
    doc += "\" target.";
  } else {
    doc = "Recursive \"";
    doc += pass;
    doc += "\" directory target.";
  }
  lg->WriteMakeRule(ruleFileStream, doc.c_str(), makeTarget, depends, commands,
                    true);
}